

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::ConstPubkeyProvider::ToString_abi_cxx11_
          (ConstPubkeyProvider *this,StringType type)

{
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  size_type in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  CPubKey *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  uchar *in_stack_fffffffffffffff0;
  size_t sVar1;
  
  sVar1 = *(size_t *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RSI + 0x4d) & 1) == 0) {
    Span<const_unsigned_char>::Span<CPubKey>
              ((Span<const_unsigned_char> *)in_RDI,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68);
    s_00.m_size = sVar1;
    s_00.m_data = in_stack_fffffffffffffff0;
    HexStr_abi_cxx11_(s_00);
  }
  else {
    Span<const_unsigned_char>::Span<CPubKey>
              ((Span<const_unsigned_char> *)in_RDI,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68);
    s.m_size = sVar1;
    s.m_data = in_stack_fffffffffffffff0;
    HexStr_abi_cxx11_(s);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_ffffffffffffff90,in_RSI,(size_type)in_RDI);
    std::__cxx11::string::~string(in_stack_ffffffffffffff68);
  }
  if (*(size_t *)(in_FS_OFFSET + 0x28) != sVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::string ToString(StringType type) const override { return m_xonly ? HexStr(m_pubkey).substr(2) : HexStr(m_pubkey); }